

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

Info * __thiscall
CMU462::DynamicScene::Skeleton::getInfo_abi_cxx11_(Info *__return_storage_ptr__,Skeleton *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  allocator<char> local_41;
  value_type local_40;
  undefined1 local_19;
  Skeleton *local_18;
  Skeleton *this_local;
  Info *info;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Skeleton *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  if (((this->super_SceneObject).scene == (Scene *)0x0) ||
     ((((this->super_SceneObject).scene)->selected).element == (HalfedgeElement *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SKELETON",&local_41);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    (*((((this->super_SceneObject).scene)->selected).element)->_vptr_HalfedgeElement[3])(&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(__return_storage_ptr__,&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Info Skeleton::getInfo()
  {
    Info info;

    if (!scene || !scene->selected.element)
    {
      info.push_back("SKELETON");
    }
    else
    {
      info = scene->selected.element->getInfo();
    }

    return info;
  }